

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

int ShGetUniformLocation(ShHandle handle,char *name)

{
  long *plVar1;
  TUniformMap *uniformMap;
  TShHandleBase *base;
  char *name_local;
  ShHandle handle_local;
  
  if (handle == (ShHandle)0x0) {
    handle_local._4_4_ = -1;
  }
  else {
    plVar1 = (long *)(**(code **)(*handle + 0x20))();
    if (plVar1 == (long *)0x0) {
      handle_local._4_4_ = -1;
    }
    else {
      handle_local._4_4_ = (**(code **)(*plVar1 + 0x30))(plVar1,name);
    }
  }
  return handle_local._4_4_;
}

Assistant:

int ShGetUniformLocation(const ShHandle handle, const char* name)
{
    if (handle == nullptr)
        return -1;

    TShHandleBase* base = reinterpret_cast<TShHandleBase*>(handle);
    TUniformMap* uniformMap= base->getAsUniformMap();
    if (uniformMap == nullptr)
        return -1;

    return uniformMap->getLocation(name);
}